

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStream.cpp
# Opt level: O0

bool BaseFile_Read(TFileStream *pStream,ULONGLONG *pByteOffset,void *pvBuffer,DWORD dwBytesToRead)

{
  __off64_t _Var1;
  DWORD *pDVar2;
  ssize_t sVar3;
  ULONGLONG local_50;
  ssize_t bytes_read;
  DWORD dwBytesRead;
  ULONGLONG ByteOffset;
  DWORD dwBytesToRead_local;
  void *pvBuffer_local;
  ULONGLONG *pByteOffset_local;
  TFileStream *pStream_local;
  
  if (pByteOffset == (ULONGLONG *)0x0) {
    local_50 = (pStream->Base).File.FilePos;
  }
  else {
    local_50 = *pByteOffset;
  }
  bytes_read._4_4_ = 0;
  if (local_50 != (pStream->Base).File.FilePos) {
    _Var1 = lseek64((int)*(undefined8 *)((long)&pStream->Base + 0x18),local_50,0);
    if (_Var1 == -1) {
      pDVar2 = (DWORD *)__errno_location();
      SetLastError(*pDVar2);
      return false;
    }
    (pStream->Base).File.FilePos = local_50;
  }
  if (dwBytesToRead != 0) {
    sVar3 = read((int)*(undefined8 *)((long)&pStream->Base + 0x18),pvBuffer,(ulong)dwBytesToRead);
    if (sVar3 == -1) {
      pDVar2 = (DWORD *)__errno_location();
      SetLastError(*pDVar2);
      return false;
    }
    bytes_read._4_4_ = (DWORD)sVar3;
  }
  (pStream->Base).File.FilePos = local_50 + bytes_read._4_4_;
  if (bytes_read._4_4_ < dwBytesToRead) {
    if ((pStream->dwFlags & 0x800) == 0) {
      SetLastError(0x3ea);
    }
    else {
      memset((void *)((long)pvBuffer + (ulong)bytes_read._4_4_),0,
             (ulong)(dwBytesToRead - bytes_read._4_4_));
      bytes_read._4_4_ = dwBytesToRead;
    }
  }
  return bytes_read._4_4_ == dwBytesToRead;
}

Assistant:

static bool BaseFile_Read(
    TFileStream * pStream,                  // Pointer to an open stream
    ULONGLONG * pByteOffset,                // Pointer to file byte offset. If NULL, it reads from the current position
    void * pvBuffer,                        // Pointer to data to be read
    DWORD dwBytesToRead)                    // Number of bytes to read from the file
{
    ULONGLONG ByteOffset = (pByteOffset != NULL) ? *pByteOffset : pStream->Base.File.FilePos;
    DWORD dwBytesRead = 0;                  // Must be set by platform-specific code

#ifdef PLATFORM_WINDOWS
    {
        // Note: We no longer support Windows 9x.
        // Thus, we can use the OVERLAPPED structure to specify
        // file offset to read from file. This allows us to skip
        // one system call to SetFilePointer

        // Update the byte offset
        pStream->Base.File.FilePos = ByteOffset;

        // Read the data
        if(dwBytesToRead != 0)
        {
            OVERLAPPED Overlapped;

            Overlapped.OffsetHigh = (DWORD)(ByteOffset >> 32);
            Overlapped.Offset = (DWORD)ByteOffset;
            Overlapped.hEvent = NULL;
            if(!ReadFile(pStream->Base.File.hFile, pvBuffer, dwBytesToRead, &dwBytesRead, &Overlapped))
                return false;
        }
    }
#endif

#if defined(PLATFORM_MAC) || defined(PLATFORM_LINUX)
    {
        ssize_t bytes_read;

        // If the byte offset is different from the current file position,
        // we have to update the file position
        if(ByteOffset != pStream->Base.File.FilePos)
        {
            if(lseek64((intptr_t)pStream->Base.File.hFile, (off64_t)(ByteOffset), SEEK_SET) == (off64_t)-1)
            {
                SetLastError(errno);
                return false;
            }
            pStream->Base.File.FilePos = ByteOffset;
        }

        // Perform the read operation
        if(dwBytesToRead != 0)
        {
            bytes_read = read((intptr_t)pStream->Base.File.hFile, pvBuffer, (size_t)dwBytesToRead);
            if(bytes_read == -1)
            {
                SetLastError(errno);
                return false;
            }

            dwBytesRead = (DWORD)(size_t)bytes_read;
        }
    }
#endif

    // Increment the current file position by number of bytes read
    pStream->Base.File.FilePos = ByteOffset + dwBytesRead;

    // If the number of bytes read doesn't match to required amount, return false
    // However, Blizzard's CASC handlers read encoded data so that if less than expected
    // was read, then they fill the rest with zeros
    if(dwBytesRead < dwBytesToRead)
    {
        if(pStream->dwFlags & STREAM_FLAG_FILL_MISSING)
        {
            memset((LPBYTE)pvBuffer + dwBytesRead, 0, (dwBytesToRead - dwBytesRead));
            dwBytesRead = dwBytesToRead;
        }
        else
        {
            SetLastError(ERROR_HANDLE_EOF);
        }
    }
        
    return (dwBytesRead == dwBytesToRead);
}